

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall ASDCP::MXF::ContentStorage::ContentStorage(ContentStorage *this,Dictionary *d)

{
  _Base_ptr p_Var1;
  Dictionary *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  MDDEntry *pMVar4;
  
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__ContentStorage_00222ec8;
  p_Var1 = &(this->Packages).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.
            super_PushSet<Kumu::UUID>.
            super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
            super__Rb_tree_header._M_header;
  (this->Packages).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.
  super_PushSet<Kumu::UUID>.
  super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->Packages).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.
           super_PushSet<Kumu::UUID>.
           super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
           super__Rb_tree_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->Packages).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.
           super_PushSet<Kumu::UUID>.
           super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
           super__Rb_tree_header + 0x10) = p_Var1;
  *(_Base_ptr *)
   ((long)&(this->Packages).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.
           super_PushSet<Kumu::UUID>.
           super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
           super__Rb_tree_header + 0x18) = p_Var1;
  *(size_t *)
   ((long)&(this->Packages).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.
           super_PushSet<Kumu::UUID>.
           super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
           super__Rb_tree_header + 0x20) = 0;
  (this->Packages).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.
  super_PushSet<Kumu::UUID>._vptr_PushSet = (_func_int **)&PTR__FixedSizeItemCollection_00225860;
  (this->Packages).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.super_IArchive.
  _vptr_IArchive = (_func_int **)&PTR__Batch_002258a0;
  p_Var1 = &(this->EssenceContainerData).
            super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.
            super_PushSet<Kumu::UUID>.
            super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
            super__Rb_tree_header._M_header;
  (this->EssenceContainerData).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.
  super_PushSet<Kumu::UUID>.
  super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->EssenceContainerData).
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.super_PushSet<Kumu::UUID>
           .super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
           super__Rb_tree_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&(this->EssenceContainerData).
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.super_PushSet<Kumu::UUID>
           .super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
           super__Rb_tree_header + 0x10) = p_Var1;
  *(_Base_ptr *)
   ((long)&(this->EssenceContainerData).
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.super_PushSet<Kumu::UUID>
           .super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
           super__Rb_tree_header + 0x18) = p_Var1;
  *(size_t *)
   ((long)&(this->EssenceContainerData).
           super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.super_PushSet<Kumu::UUID>
           .super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>._M_t._M_impl.
           super__Rb_tree_header + 0x20) = 0;
  (this->EssenceContainerData).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.
  super_PushSet<Kumu::UUID>._vptr_PushSet = (_func_int **)&PTR__FixedSizeItemCollection_00225860;
  (this->EssenceContainerData).super_FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>.
  super_IArchive._vptr_IArchive = (_func_int **)&PTR__Batch_002258a0;
  this_00 = (this->super_InterchangeObject).m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar4 = Dictionary::Type(this_00,MDD_ContentStorage);
    uVar2 = *(undefined8 *)pMVar4->ul;
    uVar3 = *(undefined8 *)(pMVar4->ul + 8);
    (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value = uVar2;
    *(undefined8 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) =
         uVar3;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x11a,"ASDCP::MXF::ContentStorage::ContentStorage(const Dictionary *)");
}

Assistant:

ContentStorage::ContentStorage(const Dictionary* d) : InterchangeObject(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_ContentStorage);
}